

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationIdentifier.h
# Opt level: O2

void __thiscall
KDIS::PDU::Electromagnetic_Emission_PDU::SetEmittingEntityID
          (Electromagnetic_Emission_PDU *this,EntityIdentifier *ID)

{
  KUINT16 KVar1;
  
  KVar1 = (ID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_EmittingEntityID).super_SimulationIdentifier.m_ui16SiteID =
       (ID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_EmittingEntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  *(undefined2 *)&(this->m_EmittingEntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(ID->super_SimulationIdentifier).field_0xc;
  return;
}

Assistant:

class KDIS_EXPORT SimulationIdentifier : public DataTypeBase
{
protected:

    KUINT16 m_ui16SiteID;

    KUINT16 m_ui16ApplicationID;

public:

    static const KUINT16 SIMULATION_IDENTIFIER_SIZE = 4;

    SimulationIdentifier();

    SimulationIdentifier( KUINT16 SiteID, KUINT16 ApplicatonID );

    SimulationIdentifier(KDataStream &stream) noexcept(false);

    virtual ~SimulationIdentifier();

    //************************************
    // FullName:    KDIS::DATA_TYPE::SimulationIdentifier::SetSiteID
    //              KDIS::DATA_TYPE::SimulationIdentifier::GetSiteID
    // Description: Site ID.
    //              A site is defined as a facility, installation, organizational unit or a geographic
    //              location that has one or more simulation applications capable of participating in a
    //              distributed event. A facility, installation, organizational unit or geographic location
    //              may have multiple sites associated with it.
    //              Each site participating in an event (e.g., training exercise, experiment, test) shall be
    //              assigned a unique Site Number that is different from any other site that is part of the same event.
    //              A simulation site is a site that generates simulated objects based on simulated data. A live site
    //              is a site that is associated with producing live objects from live sources such as producing
    //              entities representing live aircraft flying in a live training range. A simulation associated
    //              with a live site may issue Live Entity PDUs (e.g., the TSPI PDU) for the live objects or may
    //              issue Entity State PDUs for them.
    // Parameter:   KUINT16 ID
    //************************************
    void SetSiteID( KUINT16 ID );
    KUINT16 GetSiteID() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::SimulationIdentifier::SetApplicationID
    //              KDIS::DATA_TYPE::SimulationIdentifier::GetApplicationID
    // Description: Application ID.
    //              An application is defined as a software program that is used to generate and process
    //              distributed simulation data including live, virtual and constructive data.
    //              Each application participating in an event (e.g., training exercise) shall be
    //              assigned a unique Application Number for the site with which the application is associated.
    // Parameter:   KUINT16 ID
    //************************************
    void SetApplicationID( KUINT16 ID );
    KUINT16 GetApplicationID() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::SimulationIdentifier::GetAsString
    // Description: Returns a string representation.
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::SimulationIdentifier::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::SimulationIdentifier::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const SimulationIdentifier & Value ) const;
    KBOOL operator != ( const SimulationIdentifier & Value ) const;
    KBOOL operator <  ( const SimulationIdentifier & Value ) const;
}